

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  u32 uVar1;
  int iVar2;
  uint uVar3;
  CellInfo *pInfo;
  char in_CL;
  u32 in_EDX;
  u32 in_ESI;
  undefined1 *in_RDI;
  CellInfo info;
  u8 *pCell;
  int nCell;
  int i;
  u8 isInitOrig;
  ushort local_3a;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar4;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 uVar5;
  
  if (in_CL == '\x04') {
    uVar1 = sqlite3Get4byte(*(u8 **)(in_RDI + 0x50));
    if (uVar1 != in_ESI) {
      iVar2 = sqlite3CorruptError(0);
      return iVar2;
    }
    sqlite3Put4byte(*(uchar **)(in_RDI + 0x50),in_EDX);
  }
  else {
    uVar5 = *in_RDI;
    btreeInitPage((MemPage *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    uVar3 = (uint)*(ushort *)(in_RDI + 0x12);
    for (uVar4 = 0; (int)uVar4 < (int)uVar3; uVar4 = uVar4 + 1) {
      pInfo = (CellInfo *)
              (*(long *)(in_RDI + 0x50) +
              (long)(int)(uint)(*(ushort *)(in_RDI + 0x14) &
                               CONCAT11(*(undefined1 *)
                                         (*(long *)(in_RDI + 0x60) + (long)(int)(uVar4 << 1)),
                                        *(undefined1 *)
                                         (*(long *)(in_RDI + 0x60) + 1 + (long)(int)(uVar4 << 1)))))
      ;
      if (in_CL == '\x03') {
        btreeParseCellPtr((MemPage *)
                          CONCAT17(3,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffffe4,uVar4))),
                          (u8 *)CONCAT44(uVar3,in_stack_ffffffffffffffd8),pInfo);
        if (((local_3a != 0) &&
            ((ulong)((long)&pInfo->nKey + (long)(int)(uint)local_3a + 3) <=
             (ulong)(*(long *)(in_RDI + 0x50) + (long)(int)(uint)*(ushort *)(in_RDI + 0x14)))) &&
           (uVar1 = sqlite3Get4byte((u8 *)((long)&pInfo->nKey + (ulong)local_3a)), in_ESI == uVar1))
        {
          sqlite3Put4byte((uchar *)((long)&pInfo->nKey + (ulong)local_3a),in_EDX);
          break;
        }
      }
      else {
        uVar1 = sqlite3Get4byte((u8 *)pInfo);
        if (uVar1 == in_ESI) {
          sqlite3Put4byte((uchar *)pInfo,in_EDX);
          break;
        }
      }
    }
    if (uVar4 == uVar3) {
      if ((in_CL != '\x05') ||
         (uVar1 = sqlite3Get4byte((u8 *)(*(long *)(in_RDI + 0x50) + (long)(int)((byte)in_RDI[6] + 8)
                                        )), uVar1 != in_ESI)) {
        iVar2 = sqlite3CorruptError(0);
        return iVar2;
      }
      sqlite3Put4byte((uchar *)(*(long *)(in_RDI + 0x50) + (long)(int)((byte)in_RDI[6] + 8)),in_EDX)
      ;
    }
    *in_RDI = uVar5;
  }
  return 0;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_BKPT;
    }
    put4byte(pPage->aData, iTo);
  }else{
    u8 isInitOrig = pPage->isInit;
    int i;
    int nCell;

    btreeInitPage(pPage);
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        btreeParseCellPtr(pPage, pCell, &info);
        if( info.iOverflow
         && pCell+info.iOverflow+3<=pPage->aData+pPage->maskPage
         && iFrom==get4byte(&pCell[info.iOverflow])
        ){
          put4byte(&pCell[info.iOverflow], iTo);
          break;
        }
      }else{
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }
  
    if( i==nCell ){
      if( eType!=PTRMAP_BTREE || 
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_BKPT;
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }

    pPage->isInit = isInitOrig;
  }
  return SQLITE_OK;
}